

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::DtlsSession::Handshake(Error *__return_storage_ptr__,DtlsSession *this)

{
  ConnectHandler *pCVar1;
  _Manager_type *pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Manager_type p_Var4;
  int aMbedtlsError;
  char *pcVar5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  size_t local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  code *local_80;
  string local_78;
  Error local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState != kConnecting) {
    return __return_storage_ptr__;
  }
  aMbedtlsError = mbedtls_ssl_handshake(&this->mSsl);
  if (((this->mState == kConnecting) && ((this->mSsl).state == 0x1b)) &&
     (this->mState = kConnected,
     (this->mOnConnected).super__Function_base._M_manager != (_Manager_type)0x0)) {
    pCVar1 = &this->mOnConnected;
    paVar3 = &local_58.mMessage.field_2;
    local_58.mCode = kNone;
    local_58.mMessage._M_string_length = 0;
    local_58.mMessage.field_2._M_local_buf[0] = '\0';
    local_58.mMessage._M_dataplus._M_p = (pointer)paVar3;
    (*(this->mOnConnected)._M_invoker)((_Any_data *)pCVar1,this,&local_58);
    pp_Var2 = &(this->mOnConnected).super__Function_base._M_manager;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.mMessage._M_dataplus._M_p != paVar3) {
      operator_delete(local_58.mMessage._M_dataplus._M_p);
    }
    p_Var4 = *pp_Var2;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
      *pp_Var2 = (_Manager_type)0x0;
      (this->mOnConnected)._M_invoker = (_Invoker_type)0x0;
    }
  }
  if (aMbedtlsError == -0x6800) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"dtls","");
    local_a8._0_4_ = pointer_type;
    local_a0._M_p = "session(={}) handshake timeout";
    local_98 = 0x1e;
    local_90._M_allocated_capacity = 0x100000000;
    local_80 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    begin = "session(={}) handshake timeout";
    local_90._8_8_ = (format_string_checker<char> *)local_a8;
    do {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                           (begin,"",(format_string_checker<char> *)local_a8);
      }
      begin = pcVar5;
    } while (pcVar5 != "");
    fmt.size_ = 0xe;
    fmt.data_ = (char *)0x1e;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_a8;
    local_a8 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"session(={}) handshake timeout",fmt,args);
    Log(kError,&local_c8,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  else if (aMbedtlsError == -0x6a80) {
    Reconnect(this);
    local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
    local_98 = 0;
    local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->mCode = kNone;
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_a0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p == &local_90) {
      return __return_storage_ptr__;
    }
    goto LAB_001b9f5f;
  }
  ErrorFromMbedtlsError((Error *)local_a8,aMbedtlsError);
  __return_storage_ptr__->mCode = local_a8._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p == &local_90) {
    return __return_storage_ptr__;
  }
LAB_001b9f5f:
  operator_delete(local_a0._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Handshake()
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnecting);

    rval = mbedtls_ssl_handshake(&mSsl);

    if (mState == State::kConnecting && mSsl.state == MBEDTLS_SSL_HANDSHAKE_OVER)
    {
        mState = State::kConnected;
        if (mOnConnected != nullptr)
        {
            mOnConnected(*this, ERROR_NONE);
            mOnConnected = nullptr;
        }
    }

    switch (rval)
    {
    case MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED:
        Reconnect();
        error = ERROR_NONE;
        break;

    case MBEDTLS_ERR_SSL_TIMEOUT:
        LOG_ERROR(LOG_REGION_DTLS, "session(={}) handshake timeout", static_cast<void *>(this));

        // Fall through

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}